

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O1

void __thiscall Node::OutputMap(Node *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VariableStruct *this_00;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  this_00 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,(Node *)0x0,0);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  poVar2 = (ostream *)std::ostream::flush();
  iVar4 = 0;
  if (0 < Level) {
    iVar4 = Level;
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)iVar4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"// #pragma psect static_rw ",0x1b);
  VariableStruct::GetName_abi_cxx11_(&local_b0,this_00,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",gbl,ovr",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_90 = local_80;
  if ((this->Tree[1]->Type == 0x1d8) && (this->Tree[1]->Block[0] == (Node *)0x0)) {
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"class ",6);
    VariableStruct::GetName_abi_cxx11_(&local_b0,this_00,1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_C : public ",0xc);
    OutputNodeVarType_abi_cxx11_(&local_50,this->Tree[1]->Tree[1]);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    local_90 = local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ",2);
    Expression_abi_cxx11_(&local_b0,this->Tree[1]->Tree[0]);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    plVar3 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_90 == local_80) {
      return;
    }
  }
  else {
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"class ",6);
    VariableStruct::GetName_abi_cxx11_(&local_b0,this_00,1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_C",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"public:",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    Level = Level + 1;
    if (this->Tree[1] != (Node *)0x0) {
      OutputDefinitionList(this->Tree[1],os,(Node *)0x0,0,0);
    }
    Level = Level + -1;
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    local_90 = local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ",2);
    VariableStruct::GetName_abi_cxx11_(&local_b0,this_00,1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    plVar3 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_90 == local_80) {
      return;
    }
  }
  operator_delete(local_90,local_80[0] + 1);
  return;
}

Assistant:

void Node::OutputMap(
	std::ostream& os		/**< iostream to write C++ code to */
)
{
	VariableStruct* ThisVar = Variables->Lookup(Tree[0]->TextValue, 0);

	os << std::endl << Indent() <<
		"// #pragma psect static_rw " << ThisVar->GetName(1) <<
		",gbl,ovr" << std::endl;

	//
	// We implement MAP and COMMON as classes because dealing with
	// their weirdness will be easier by creating methods in a base
	// class than putting stuff in the actual source. It should also
	// make putting everything in a common place simpler.
	//
	// Here we try to 'roll up' a MAP statement of the form
	//	MAP (my_map) my_regord my_var
	// into a shorder form than more comples MAPs. It means we can
	// rever to the values as 'my_var.value' instead of
	// 'my_map.my_var.value'.
	// Similiar code must exist in program.cc arount the prefix
	// generating code
	//
	if ((Tree[1]->Type == BAS_V_DEFINEVAR) && (Tree[1]->Block[0] == 0))
	{
		os <<
			Indent() << "class " << ThisVar->GetName(1) <<
				"_C : public " <<
				Tree[1]->Tree[1]->OutputNodeVarType() <<
				std::endl <<
			Indent() << "{" << std::endl;

		std::cout <<
			Indent() << "} " << Tree[1]->Tree[0]->Expression() <<
				";" << std::endl <<
			std::endl;
	}
	else
	{
		os <<
			Indent() << "class " << ThisVar->GetName(1) <<
				"_C" << std::endl <<
			Indent() << "{" << std::endl <<
			Indent() << "public:" << std::endl;

		Level++;

		if (Tree[1] != 0)
		{
			Tree[1]->OutputDefinitionList(os, 0, 0);
		}

		Level--;
		std::cout <<
			Indent() << "} " << ThisVar->GetName(1) << ";" << std::endl <<
			std::endl;
	}

//	os << "// #pragma psect end " << ThisVar->GetName() << std::endl;
}